

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessMemberTestSuite.cpp
# Opt level: O2

bool changeValueOfSimpleMember(void)

{
  int iVar1;
  Test t;
  Test local_40;
  
  local_40.mFoo = 0;
  local_40.mFoo2 = 1;
  local_40.mFooBar.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_40.mFooBar.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_40.mFooBar.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_40.mFooBar2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_40.mFooBar2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_40.mFooBar2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined4 *)((long)&local_40.mFoo + accessor::Proxy<TestFoo,TestFoo>::value) = 100;
  *(undefined4 *)((long)&local_40.mFoo + accessor::Proxy<TestFoo2,TestFoo2>::value) = 0x65;
  iVar1 = *(int *)((long)&local_40.mFoo + accessor::Proxy<TestFoo,TestFoo>::value);
  Test::~Test(&local_40);
  return iVar1 == 100;
}

Assistant:

bool changeValueOfSimpleMember()
{
  Test t;

  ::accessor::accessMember<TestFoo>(t).get() = 100;
  ::accessor::accessMember<TestFoo2>(t).get() = 101;
  return (::accessor::accessMember<TestFoo>(t) == 100)
      && (::accessor::accessMember<TestFoo2>(t) == 101);
}